

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiCond cond)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  
  if ((cond == 0) || (((char)window->field_0xf1 & cond) != 0)) {
    window->field_0xf1 = window->field_0xf1 & 0xf1;
    uVar4 = window->Flags;
    if (((uVar4 >> 0x18 & 1) == 0) ||
       ((window->Appearing != false || ((window->ChildFlags & 0x40) != 0)))) {
      window->AutoFitFramesX = (size->x <= 0.0) * '\x02';
    }
    if ((((uVar4 >> 0x18 & 1) == 0) || (window->Appearing != false)) ||
       ((window->ChildFlags & 0x40) != 0)) {
      window->AutoFitFramesY = (size->y <= 0.0) * '\x02';
    }
    fVar2 = (window->SizeFull).x;
    if (size->x <= 0.0) {
      window->AutoFitOnlyGrows = false;
    }
    else {
      (window->SizeFull).x = (float)(int)size->x;
    }
    fVar3 = (window->SizeFull).y;
    if (size->y <= 0.0) {
      window->AutoFitOnlyGrows = false;
    }
    else {
      (window->SizeFull).y = (float)(int)size->y;
    }
    if ((fVar2 == (window->SizeFull).x) && (!NAN(fVar2) && !NAN((window->SizeFull).x))) {
      pfVar1 = &(window->SizeFull).y;
      if ((fVar3 == *pfVar1) && (!NAN(fVar3) && !NAN(*pfVar1))) {
        return;
      }
    }
    if (((uVar4 >> 8 & 1) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
      GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowSizeAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Enable auto-fit (not done in BeginChild() path unless appearing or combined with ImGuiChildFlags_AlwaysAutoResize)
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) == 0 || window->Appearing || (window->ChildFlags & ImGuiChildFlags_AlwaysAutoResize) != 0)
        window->AutoFitFramesX = (size.x <= 0.0f) ? 2 : 0;
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) == 0 || window->Appearing || (window->ChildFlags & ImGuiChildFlags_AlwaysAutoResize) != 0)
        window->AutoFitFramesY = (size.y <= 0.0f) ? 2 : 0;

    // Set
    ImVec2 old_size = window->SizeFull;
    if (size.x <= 0.0f)
        window->AutoFitOnlyGrows = false;
    else
        window->SizeFull.x = IM_TRUNC(size.x);
    if (size.y <= 0.0f)
        window->AutoFitOnlyGrows = false;
    else
        window->SizeFull.y = IM_TRUNC(size.y);
    if (old_size.x != window->SizeFull.x || old_size.y != window->SizeFull.y)
        MarkIniSettingsDirty(window);
}